

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

decNumber_conflict * decNumberFromUInt32(decNumber_conflict *dn,uint32_t uin)

{
  int32_t iVar1;
  uint16_t *local_28;
  uint16_t *up;
  uint32_t uin_local;
  decNumber_conflict *dn_local;
  
  decNumberZero(dn);
  if (uin != 0) {
    local_28 = dn->lsu;
    for (up._4_4_ = uin; up._4_4_ != 0; up._4_4_ = up._4_4_ / 1000) {
      *local_28 = (uint16_t)((ulong)up._4_4_ % 1000);
      local_28 = local_28 + 1;
    }
    iVar1 = decGetDigits(dn->lsu,(int32_t)((long)local_28 - (long)dn->lsu >> 1));
    dn->digits = iVar1;
  }
  return dn;
}

Assistant:

decNumber * decNumberFromUInt32(decNumber *dn, uInt uin) {
  Unit *up;				/* work pointer */
  decNumberZero(dn);			/* clean */
  if (uin==0) return dn;		/* [or decGetDigits bad call] */
  for (up=dn->lsu; uin>0; up++) {
    *up=(Unit)(uin%(DECDPUNMAX+1));
    uin=uin/(DECDPUNMAX+1);
    }
  dn->digits=decGetDigits(dn->lsu, up-dn->lsu);
  return dn;
  }